

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::init
          (SampleMaskCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *__return_storage_ptr__;
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  NotSupportedError *pNVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  size_type sVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  Vector<float,_4> local_7d4;
  Vector<float,_4> local_7c4;
  Vector<float,_4> local_7b4;
  Vector<float,_4> local_7a4;
  Vector<float,_4> local_794;
  Vector<float,_4> local_784;
  int local_774;
  int local_770;
  int x;
  int y;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridData;
  MessageBuilder local_5d0;
  undefined1 local_44a;
  allocator<char> local_449;
  string local_448;
  MessageBuilder local_428;
  MessageBuilder local_2a8;
  undefined1 local_122;
  allocator<char> local_121;
  string local_120;
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d1;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  int local_1c;
  GLint maxSampleMaskWords;
  GLint maxSamples;
  Functions *gl;
  SampleMaskCase_conflict *this_local;
  
  gl = (Functions *)this;
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _maxSampleMaskWords = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  local_20 = 0;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar5);
  if (this->m_maxSampleMaskWords <= iVar2) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getHeight(pRVar5);
    if (this->m_maxSampleMaskWords <= iVar2) {
      (**(code **)(_maxSampleMaskWords + 0x868))(0x8e59,&local_20);
      if (local_20 <
          *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4))
      {
        local_fa = 1;
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS",&local_f9);
        tcu::NotSupportedError::NotSupportedError(pNVar6,&local_f8);
        local_fa = 0;
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      (**(code **)(_maxSampleMaskWords + 0x868))(0x910e,&local_1c);
      if (local_1c < (int)this->m_verifierType) {
        local_122 = 1;
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,
                   "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES",&local_121)
        ;
        tcu::NotSupportedError::NotSupportedError(pNVar6,&local_120);
        local_122 = 0;
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_2a8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_2a8,(char (*) [32])"GL_MAX_COLOR_TEXTURE_SAMPLES = ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1c);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2a8);
      if ((((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) != 0) &&
         ((int)this->m_verifierType % 0x20 == 0)) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_428,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_428,
                            (char (*) [85])
                            "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping."
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_428);
        local_44a = 1;
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_448,
                   "Test requires unused high bits (sample count not multiple of 32)",&local_449);
        tcu::NotSupportedError::NotSupportedError(pNVar6,&local_448);
        local_44a = 0;
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_5d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_5d0,
                          (char (*) [48])"Creating multisample texture with sample count ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&this->m_verifierType);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_5d0);
      (**(code **)(_maxSampleMaskWords + 0x6f8))
                (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_0x4);
      (**(code **)(_maxSampleMaskWords + 0xb8))
                (0x9100,*(undefined4 *)
                         &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_0x4);
      (**(code **)(_maxSampleMaskWords + 0x1390))
                (0x9100,this->m_verifierType,0x8058,this->m_maxSampleMaskWords,
                 this->m_maxSampleMaskWords,0);
      dVar3 = (**(code **)(_maxSampleMaskWords + 0x800))();
      glu::checkError(dVar3,"texStorage2DMultisample",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x28e);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      __return_storage_ptr__ =
           &gridData.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      tcu::TestLog::operator<<
                ((MessageBuilder *)__return_storage_ptr__,pTVar7,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)__return_storage_ptr__,
                          (char (*) [25])"Attaching texture to FBO");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)
                 &gridData.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (**(code **)(_maxSampleMaskWords + 0x6d0))
                (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
      (**(code **)(_maxSampleMaskWords + 0x78))
                (0x8d40,*(undefined4 *)
                         &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
      (**(code **)(_maxSampleMaskWords + 0x6a0))
                (0x8d40,0x8ce0,0x9100,
                 *(undefined4 *)
                  &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_0x4,0);
      dVar3 = (**(code **)(_maxSampleMaskWords + 0x800))();
      glu::checkError(dVar3,"framebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x297);
      (**(code **)(_maxSampleMaskWords + 0x708))
                (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
      dVar3 = (**(code **)(_maxSampleMaskWords + 0x800))();
      glu::checkError(dVar3,"genVertexArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x29c);
      (**(code **)(_maxSampleMaskWords + 0x6c8))
                (1,(undefined1 *)
                   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                           _M_string_length + 4));
      (**(code **)(_maxSampleMaskWords + 0x40))
                (0x8892,*(undefined4 *)
                         ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                                 _M_string_length + 4));
      dVar3 = (**(code **)(_maxSampleMaskWords + 0x800))();
      glu::checkError(dVar3,"genBuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x2a0);
      iVar2 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      std::allocator<tcu::Vector<float,_4>_>::allocator
                ((allocator<tcu::Vector<float,_4>_> *)((long)&x + 3));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y,
                 (long)(iVar2 * iVar2 * 6),(allocator<tcu::Vector<float,_4>_> *)((long)&x + 3));
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)((long)&x + 3));
      for (local_770 = 0;
          local_770 < *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          local_770 = local_770 + 1) {
        for (local_774 = 0;
            local_774 < *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
            ; local_774 = local_774 + 1) {
          fVar13 = (float)*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                   _vptr_TestNode;
          fVar12 = (float)local_774 / fVar13;
          fVar13 = (float)local_770 / fVar13;
          tcu::Vector<float,_4>::Vector
                    (&local_784,fVar12 + fVar12 + -1.0,fVar13 + fVar13 + -1.0,0.0,1.0);
          pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&y,(long)((local_770 *
                                            *(int *)&this[1].super_TestCase.super_TestCase.
                                                     super_TestNode._vptr_TestNode + local_774) * 6)
                             );
          *(undefined8 *)pvVar9->m_data = local_784.m_data._0_8_;
          *(undefined8 *)(pvVar9->m_data + 2) = local_784.m_data._8_8_;
          fVar13 = (float)*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                   _vptr_TestNode;
          fVar12 = (float)local_774 / fVar13;
          fVar13 = (float)(local_770 + 1) / fVar13;
          tcu::Vector<float,_4>::Vector
                    (&local_794,fVar12 + fVar12 + -1.0,fVar13 + fVar13 + -1.0,0.0,1.0);
          pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&y,(long)((local_770 *
                                            *(int *)&this[1].super_TestCase.super_TestCase.
                                                     super_TestNode._vptr_TestNode + local_774) * 6
                                          + 1));
          *(undefined8 *)pvVar9->m_data = local_794.m_data._0_8_;
          *(undefined8 *)(pvVar9->m_data + 2) = local_794.m_data._8_8_;
          fVar13 = (float)*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                   _vptr_TestNode;
          fVar12 = (float)(local_774 + 1) / fVar13;
          fVar13 = (float)(local_770 + 1) / fVar13;
          tcu::Vector<float,_4>::Vector
                    (&local_7a4,fVar12 + fVar12 + -1.0,fVar13 + fVar13 + -1.0,0.0,1.0);
          pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&y,(long)((local_770 *
                                            *(int *)&this[1].super_TestCase.super_TestCase.
                                                     super_TestNode._vptr_TestNode + local_774) * 6
                                          + 2));
          *(undefined8 *)pvVar9->m_data = local_7a4.m_data._0_8_;
          *(undefined8 *)(pvVar9->m_data + 2) = local_7a4.m_data._8_8_;
          fVar13 = (float)*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                   _vptr_TestNode;
          fVar12 = (float)local_774 / fVar13;
          fVar13 = (float)local_770 / fVar13;
          tcu::Vector<float,_4>::Vector
                    (&local_7b4,fVar12 + fVar12 + -1.0,fVar13 + fVar13 + -1.0,0.0,1.0);
          pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&y,(long)((local_770 *
                                            *(int *)&this[1].super_TestCase.super_TestCase.
                                                     super_TestNode._vptr_TestNode + local_774) * 6
                                          + 3));
          *(undefined8 *)pvVar9->m_data = local_7b4.m_data._0_8_;
          *(undefined8 *)(pvVar9->m_data + 2) = local_7b4.m_data._8_8_;
          fVar13 = (float)*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                   _vptr_TestNode;
          fVar12 = (float)(local_774 + 1) / fVar13;
          fVar13 = (float)(local_770 + 1) / fVar13;
          tcu::Vector<float,_4>::Vector
                    (&local_7c4,fVar12 + fVar12 + -1.0,fVar13 + fVar13 + -1.0,0.0,1.0);
          pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&y,(long)((local_770 *
                                            *(int *)&this[1].super_TestCase.super_TestCase.
                                                     super_TestNode._vptr_TestNode + local_774) * 6
                                          + 4));
          *(undefined8 *)pvVar9->m_data = local_7c4.m_data._0_8_;
          *(undefined8 *)(pvVar9->m_data + 2) = local_7c4.m_data._8_8_;
          fVar13 = (float)*(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                   _vptr_TestNode;
          fVar12 = (float)(local_774 + 1) / fVar13;
          fVar13 = (float)local_770 / fVar13;
          tcu::Vector<float,_4>::Vector
                    (&local_7d4,fVar12 + fVar12 + -1.0,fVar13 + fVar13 + -1.0,0.0,1.0);
          pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&y,(long)((local_770 *
                                            *(int *)&this[1].super_TestCase.super_TestCase.
                                                     super_TestNode._vptr_TestNode + local_774) * 6
                                          + 5));
          *(undefined8 *)pvVar9->m_data = local_7d4.m_data._0_8_;
          *(undefined8 *)(pvVar9->m_data + 2) = local_7d4.m_data._8_8_;
        }
      }
      pcVar1 = *(code **)(_maxSampleMaskWords + 0x150);
      sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &y);
      pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &y,0);
      pfVar11 = tcu::Vector<float,_4>::getPtr(pvVar9);
      (*pcVar1)(0x8892,(long)((int)sVar10 << 4),pfVar11,0x88e4);
      dVar3 = (**(code **)(_maxSampleMaskWords + 0x800))();
      glu::checkError(dVar3,"bufferData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x2b2);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y);
      genSamplerProgram(this);
      genAlphaProgram(this);
      return extraout_EAX;
    }
  }
  local_d1 = 1;
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_a0,&this->m_maxSampleMaskWords);
  std::operator+(&local_80,"render target size must be at least ",&local_a0);
  std::operator+(&local_60,&local_80,"x");
  de::toString<int>(&local_d0,&this->m_maxSampleMaskWords);
  std::operator+(&local_40,&local_60,&local_d0);
  tcu::NotSupportedError::NotSupportedError(pNVar6,&local_40);
  local_d1 = 0;
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SampleMaskCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	glw::GLint				maxSamples			= 0;
	glw::GLint				maxSampleMaskWords	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &maxSampleMaskWords);
	if (m_effectiveSampleMaskWordCount > maxSampleMaskWords)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_SAMPLE_MASK_WORDS");

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	// Don't even try to test high bits if there are none

	if ((m_flags & FLAGS_HIGH_BITS) && (m_samples % 32 == 0))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping." << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("Test requires unused high bits (sample count not multiple of 32)");
	}

	// generate textures

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture with sample count " << m_samples << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_FALSE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	// attach texture to fbo

	m_testCtx.getLog() << tcu::TestLog::Message << "Attaching texture to FBO" << tcu::TestLog::EndMessage;

	gl.genFramebuffers		(1, &m_fboID);
	gl.bindFramebuffer		(GL_FRAMEBUFFER, m_fboID);
	gl.framebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, m_texID, 0);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "framebufferTexture2D");

	// buffers

	gl.genVertexArrays		(1, &m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "genVertexArrays");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "genBuffers");

	// generate grid pattern
	{
		std::vector<tcu::Vec4> gridData(m_gridsize*m_gridsize*6);

		for (int y = 0; y < m_gridsize; ++y)
		for (int x = 0; x < m_gridsize; ++x)
		{
			gridData[(y * m_gridsize + x)*6 + 0] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 1] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 2] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 3] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 4] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 5] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
		}

		gl.bufferData			(GL_ARRAY_BUFFER, (int)(gridData.size() * sizeof(tcu::Vec4)), gridData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR		(gl.getError(), "bufferData");
	}

	// generate programs

	genSamplerProgram();
	genAlphaProgram();
}